

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::textureLevelsTest(TestContext *testCtx,Context *context)

{
  bool bVar1;
  TestLog *this;
  MessageBuilder *pMVar2;
  GLenum expect;
  int local_1ec;
  uint local_1e8;
  int ndx;
  int levels [12];
  MessageBuilder local_1a8;
  int local_28;
  deInt32 local_24;
  int log2MaxTexSize;
  GLint maxTexSize;
  deUint32 fbo;
  deUint32 tex;
  Context *context_local;
  TestContext *testCtx_local;
  
  maxTexSize = 1;
  log2MaxTexSize = 1;
  _fbo = context;
  context_local = (Context *)testCtx;
  (*context->_vptr_Context[0x7b])(context,0xd33,&local_24);
  local_28 = ::deLog2Floor32(local_24);
  this = tcu::TestContext::getLog((TestContext *)context_local);
  tcu::TestLog::operator<<(&local_1a8,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [27])"// GL_MAX_TEXTURE_SIZE is ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_24);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])", floor(log2(");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_24);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [6])")) = ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_28);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  (*_fbo->_vptr_Context[6])(_fbo,0xde1,(ulong)(uint)maxTexSize);
  (*_fbo->_vptr_Context[0x7e])(_fbo,0xde1,0,0x1907,0x100);
  (*_fbo->_vptr_Context[0x7e])(_fbo,0xde1,1,0x1907,0x80);
  (*_fbo->_vptr_Context[9])(_fbo,0x8d40,(ulong)(uint)log2MaxTexSize);
  local_1e8 = 2;
  ndx = 1;
  levels[0] = 0;
  levels[1] = -1;
  levels[2] = 0x7fffffff;
  levels[3] = 0;
  levels[4] = local_28 + -2;
  levels[5] = local_28 + -1;
  levels[6] = local_28;
  levels[7] = local_28 + 1;
  levels[8] = local_28 + 2;
  levels[9] = 1;
  for (local_1ec = 0; local_1ec < 0xc; local_1ec = local_1ec + 1) {
    (*_fbo->_vptr_Context[0x1e])
              (_fbo,0x8d40,0x8ce0,0xde1,(ulong)(uint)maxTexSize,(ulong)(&local_1e8)[local_1ec]);
    bVar1 = false;
    if (-1 < (int)(&local_1e8)[local_1ec]) {
      bVar1 = (int)(&local_1e8)[local_1ec] <= local_28;
    }
    expect = 0x501;
    if (bVar1) {
      expect = 0;
    }
    checkError((TestContext *)context_local,_fbo,expect);
  }
  return;
}

Assistant:

static void textureLevelsTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	deUint32	tex		= 1;
	deUint32	fbo		= 1;
	GLint		maxTexSize;
	int			log2MaxTexSize;

	context.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTexSize);
	log2MaxTexSize = deLog2Floor32(maxTexSize);

	testCtx.getLog() << TestLog::Message << "// GL_MAX_TEXTURE_SIZE is " << maxTexSize << ", floor(log2(" << maxTexSize << ")) = " << log2MaxTexSize << TestLog::EndMessage;

	context.bindTexture(GL_TEXTURE_2D, tex);
	context.texImage2D(GL_TEXTURE_2D, 0, GL_RGB, 256, 256);
	context.texImage2D(GL_TEXTURE_2D, 1, GL_RGB, 128, 128);

	context.bindFramebuffer(GL_FRAMEBUFFER, fbo);

	const int levels[] = { 2, 1, 0, -1, 0x7fffffff, 0, log2MaxTexSize-2, log2MaxTexSize-1, log2MaxTexSize, log2MaxTexSize+1, log2MaxTexSize+2, 1 };

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(levels); ndx++)
	{
		context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, levels[ndx]);
		checkError(testCtx, context, levels[ndx] >= 0 && levels[ndx] <= log2MaxTexSize ? GL_NO_ERROR : GL_INVALID_VALUE);
	}
}